

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O3

int __thiscall cmCTestBuildHandler::ProcessHandler(cmCTestBuildHandler *this)

{
  char **ppcVar1;
  string *psVar2;
  string *psVar3;
  pointer pcVar4;
  cmCTest *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  pointer pcVar7;
  char cVar8;
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  size_t sVar12;
  ostream *poVar13;
  long *plVar14;
  rep rVar15;
  _func_int **pp_Var16;
  string *s;
  long lVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  char *pcVar19;
  char *pcVar20;
  cmCTestBuildErrorWarning *evit;
  char **ppcVar21;
  char *pcVar22;
  pointer pcVar23;
  cmDuration cVar24;
  int retVal;
  string srcdirrep;
  cmXMLWriter xml;
  cmGeneratedFileStream xofs;
  string makeCommand;
  cmGeneratedFileStream ofs;
  int local_720;
  undefined4 local_71c;
  long *local_718;
  long local_708 [2];
  undefined1 local_6f8 [112];
  ios_base local_688 [264];
  undefined1 local_580 [88];
  undefined1 local_528 [8];
  undefined1 local_520 [80];
  char *local_4d0;
  ios_base local_4b8 [56];
  char *local_480;
  char *local_460;
  long local_2e0;
  string local_2d8;
  string local_2b8;
  string local_298;
  undefined1 local_278 [112];
  ios_base local_208 [472];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"Build project",0xd);
  std::ios::widen((char)(ostringstream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_278);
  std::ostream::flush();
  pcVar5 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar5,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x11d,(char *)local_528,(this->super_cmCTestGenericHandler).Quiet);
  if (local_528 != (undefined1  [8])(local_520 + 8)) {
    operator_delete((void *)local_528,(ulong)(local_520._8_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base(local_208);
  cVar24 = cmCTest::GetRemainingTimeAllowed((this->super_cmCTestGenericHandler).CTest);
  iVar11 = 0;
  if (120.0 <= cVar24.__r) {
    pcVar20 = "^Warning W[0-9]+ ([a-zA-Z.\\:/0-9_+ ~-]+) ([0-9]+):";
    lVar17 = 0x10;
    do {
      local_520._0_8_ = (char *)0x0;
      local_4d0 = (char *)0x0;
      local_480 = (char *)0x0;
      local_460 = (char *)0x0;
      bVar10 = cmsys::RegularExpression::compile((RegularExpression *)local_520,pcVar20);
      if (bVar10) {
        local_528 = *(undefined1 (*) [8])((long)&PTR__cmCTestBuildHandler_00699488 + lVar17);
        std::
        vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
        ::emplace_back<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>
                  (&this->ErrorWarningFileLineRegex,(cmCTestCompileErrorWarningRex *)local_528);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"Problem Compiling regular expression: ",0x26);
        sVar12 = strlen(pcVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar20,sVar12);
        cVar8 = (char)(ostringstream *)local_278;
        std::ios::widen((char)*(undefined8 *)(local_278._0_8_ + -0x18) + cVar8);
        std::ostream::put(cVar8);
        std::ostream::flush();
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x132,(char *)local_6f8._0_8_,false);
        if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
          operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
        std::ios_base::~ios_base(local_208);
      }
      if (local_460 != (char *)0x0) {
        operator_delete__(local_460);
      }
      pcVar20 = *(char **)((long)&cmCTestWarningErrorFileLine[0].RegularExpressionString + lVar17);
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0x80);
    GetMakeCommand_abi_cxx11_(&local_2d8,this);
    if (local_2d8._M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"Cannot find MakeCommand key in the DartConfiguration.tcl",
                 0x38);
      std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
      std::ostream::put((char)local_278);
      std::ostream::flush();
      pcVar5 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar5,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x13b,(char *)local_528,false);
      if (local_528 != (undefined1  [8])(local_520 + 8)) {
        operator_delete((void *)local_528,(ulong)(local_520._8_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
      std::ios_base::~ios_base(local_208);
      iVar11 = -1;
    }
    else {
      pcVar5 = (this->super_cmCTestGenericHandler).CTest;
      pcVar4 = local_278 + 0x10;
      local_278._0_8_ = pcVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"BuildDirectory","");
      cmCTest::GetCTestConfiguration(&local_2b8,pcVar5,(string *)local_278);
      if ((pointer)local_278._0_8_ != pcVar4) {
        operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
      }
      if (local_2b8._M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,
                   "Cannot find BuildDirectory  key in the DartConfiguration.tcl",0x3c);
        std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_278);
        std::ostream::flush();
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x144,(char *)local_528,false);
        if (local_528 != (undefined1  [8])(local_520 + 8)) {
          operator_delete((void *)local_528,(ulong)(local_520._8_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
        std::ios_base::~ios_base(local_208);
        iVar11 = -1;
      }
      else {
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        local_278._0_8_ = pcVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"UseLaunchers","");
        cmCTest::GetCTestConfiguration(&local_298,pcVar5,(string *)local_278);
        if ((pointer)local_278._0_8_ != pcVar4) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        bVar10 = cmSystemTools::IsOn(&local_298);
        this->UseCTestLaunch = bVar10;
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_278,None);
        lVar17 = std::chrono::_V2::steady_clock::now();
        bVar10 = cmCTestGenericHandler::StartLogFile
                           (&this->super_cmCTestGenericHandler,"Build",
                            (cmGeneratedFileStream *)local_278);
        if (!bVar10) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_528,"Cannot create build log file",0x1c);
          std::ios::widen((char)(ostream *)local_528 +
                          (char)*(_func_int **)((long)local_528 + -0x18));
          std::ostream::put((char)local_528);
          std::ostream::flush();
          pcVar5 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar5,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x151,(char *)local_6f8._0_8_,false);
          if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
            operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
          std::ios_base::~ios_base(local_4b8);
        }
        if (cmCTestErrorMatches[0] != (char *)0x0) {
          ppcVar21 = cmCTestErrorMatches;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->CustomErrorMatches,ppcVar21);
            ppcVar1 = ppcVar21 + 1;
            ppcVar21 = ppcVar21 + 1;
          } while (*ppcVar1 != (char *)0x0);
        }
        if (cmCTestErrorExceptions[0] != (char *)0x0) {
          ppcVar21 = cmCTestErrorExceptions;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->CustomErrorExceptions,ppcVar21);
            ppcVar1 = ppcVar21 + 1;
            ppcVar21 = ppcVar21 + 1;
          } while (*ppcVar1 != (char *)0x0);
        }
        if (cmCTestWarningMatches[0] != (char *)0x0) {
          ppcVar21 = cmCTestWarningMatches;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->CustomWarningMatches,ppcVar21);
            ppcVar1 = ppcVar21 + 1;
            ppcVar21 = ppcVar21 + 1;
          } while (*ppcVar1 != (char *)0x0);
        }
        if (cmCTestWarningExceptions[0] != (char *)0x0) {
          ppcVar21 = cmCTestWarningExceptions;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->CustomWarningExceptions,ppcVar21);
            ppcVar1 = ppcVar21 + 1;
            ppcVar21 = ppcVar21 + 1;
          } while (*ppcVar1 != (char *)0x0);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorMatchRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
        poVar13 = std::ostream::_M_insert<void_const*>(local_528);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"Add this->ErrorMatchRegex",0x19)
        ;
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x175,(char *)local_6f8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        local_2e0 = lVar17;
        if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
          operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
        std::ios_base::~ios_base(local_4b8);
        pbVar18 = (this->CustomErrorMatches).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 = (this->CustomErrorMatches).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar18 != pbVar6) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_528,"Add this->CustomErrorMatches: ",0x1e);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_528,(pbVar18->_M_dataplus)._M_p,
                                 pbVar18->_M_string_length);
            std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
            std::ostream::put((char)poVar13);
            std::ostream::flush();
            pcVar5 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar5,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x175,(char *)local_6f8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
              operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
            std::ios_base::~ios_base(local_4b8);
            std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                       &this->ErrorMatchRegex,pbVar18);
            pbVar18 = pbVar18 + 1;
          } while (pbVar18 != pbVar6);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorExceptionRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
        poVar13 = std::ostream::_M_insert<void_const*>(local_528);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"Add this->ErrorExceptionRegex",0x1d);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x177,(char *)local_6f8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
          operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
        std::ios_base::~ios_base(local_4b8);
        pbVar18 = (this->CustomErrorExceptions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 = (this->CustomErrorExceptions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar18 != pbVar6) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_528,"Add this->CustomErrorExceptions: ",0x21);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_528,(pbVar18->_M_dataplus)._M_p,
                                 pbVar18->_M_string_length);
            std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
            std::ostream::put((char)poVar13);
            std::ostream::flush();
            pcVar5 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar5,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x177,(char *)local_6f8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
              operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
            std::ios_base::~ios_base(local_4b8);
            std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                       &this->ErrorExceptionRegex,pbVar18);
            pbVar18 = pbVar18 + 1;
          } while (pbVar18 != pbVar6);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningMatchRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
        poVar13 = std::ostream::_M_insert<void_const*>(local_528);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"Add this->WarningMatchRegex",0x1b);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x179,(char *)local_6f8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
          operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
        std::ios_base::~ios_base(local_4b8);
        pbVar18 = (this->CustomWarningMatches).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 = (this->CustomWarningMatches).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar18 != pbVar6) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_528,"Add this->CustomWarningMatches: ",0x20);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_528,(pbVar18->_M_dataplus)._M_p,
                                 pbVar18->_M_string_length);
            std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
            std::ostream::put((char)poVar13);
            std::ostream::flush();
            pcVar5 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar5,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x179,(char *)local_6f8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
              operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
            std::ios_base::~ios_base(local_4b8);
            std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                       &this->WarningMatchRegex,pbVar18);
            pbVar18 = pbVar18 + 1;
          } while (pbVar18 != pbVar6);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningExceptionRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
        poVar13 = std::ostream::_M_insert<void_const*>(local_528);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,"Add this->WarningExceptionRegex",0x1f);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x17b,(char *)local_6f8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
          operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
        std::ios_base::~ios_base(local_4b8);
        pbVar18 = (this->CustomWarningExceptions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 = (this->CustomWarningExceptions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar18 != pbVar6) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_528,"Add this->CustomWarningExceptions: ",0x23);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_528,(pbVar18->_M_dataplus)._M_p,
                                 pbVar18->_M_string_length);
            std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
            std::ostream::put((char)poVar13);
            std::ostream::flush();
            pcVar5 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar5,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x17b,(char *)local_6f8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
              operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
            std::ios_base::~ios_base(local_4b8);
            std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                       &this->WarningExceptionRegex,pbVar18);
            pbVar18 = pbVar18 + 1;
          } while (pbVar18 != pbVar6);
        }
        (this->SimplifySourceDir)._M_string_length = 0;
        *(this->SimplifySourceDir)._M_dataplus._M_p = '\0';
        (this->SimplifyBuildDir)._M_string_length = 0;
        *(this->SimplifyBuildDir)._M_dataplus._M_p = '\0';
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        local_6f8._0_8_ = local_6f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"SourceDirectory","");
        cmCTest::GetCTestConfiguration((string *)local_528,pcVar5,(string *)local_6f8);
        uVar9 = local_520._0_8_;
        if (local_528 != (undefined1  [8])(local_520 + 8)) {
          operator_delete((void *)local_528,(ulong)(local_520._8_8_ + 1));
        }
        if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
          operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1);
        }
        psVar2 = &this->SimplifySourceDir;
        if ((char *)0x14 < (ulong)uVar9) {
          pcVar5 = (this->super_cmCTestGenericHandler).CTest;
          pcVar20 = local_580 + 0x10;
          local_580._0_8_ = pcVar20;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"SourceDirectory","");
          cmCTest::GetCTestConfiguration((string *)local_6f8,pcVar5,(string *)local_580);
          plVar14 = (long *)std::__cxx11::string::append(local_6f8);
          pp_Var16 = (_func_int **)(plVar14 + 2);
          if ((_func_int **)*plVar14 == pp_Var16) {
            local_520._8_8_ = *pp_Var16;
            local_520._16_8_ = plVar14[3];
            local_528 = (undefined1  [8])(local_520 + 8);
          }
          else {
            local_520._8_8_ = *pp_Var16;
            local_528 = (undefined1  [8])*plVar14;
          }
          local_520._0_8_ = plVar14[1];
          *plVar14 = (long)pp_Var16;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
            operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1);
          }
          if ((char *)local_580._0_8_ != pcVar20) {
            operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
          }
          local_6f8._0_8_ = local_6f8 + 0x10;
          local_6f8._8_8_ = 0;
          local_6f8[0x10] = '\0';
          if ((char *)(local_520._0_8_ + -2) != (char *)0x0) {
            pcVar22 = (char *)(local_520._0_8_ + -2) + (long)local_528;
            pcVar19 = (char *)(local_520._0_8_ + -1);
            do {
              if (*pcVar22 == '/') {
                strlen(pcVar22);
                std::__cxx11::string::_M_replace((ulong)local_6f8,0,(char *)0x0,(ulong)pcVar22);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_580,"/...",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_6f8);
                std::__cxx11::string::operator=((string *)local_6f8,(string *)local_580);
                if ((char *)local_580._0_8_ != pcVar20) {
                  operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
                }
                std::__cxx11::string::substr((ulong)local_580,(ulong)local_528);
                std::__cxx11::string::operator=((string *)local_528,(string *)local_580);
                if ((char *)local_580._0_8_ != pcVar20) {
                  operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
                }
                break;
              }
              pcVar22 = pcVar22 + -1;
              pcVar19 = pcVar19 + -1;
            } while (pcVar19 != (char *)0x1);
          }
          std::__cxx11::string::_M_assign((string *)psVar2);
          if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
            operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1);
          }
          if (local_528 != (undefined1  [8])(local_520 + 8)) {
            operator_delete((void *)local_528,(ulong)(local_520._8_8_ + 1));
          }
        }
        pcVar5 = (this->super_cmCTestGenericHandler).CTest;
        local_6f8._0_8_ = local_6f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"BuildDirectory","");
        cmCTest::GetCTestConfiguration((string *)local_528,pcVar5,(string *)local_6f8);
        uVar9 = local_520._0_8_;
        if (local_528 != (undefined1  [8])(local_520 + 8)) {
          operator_delete((void *)local_528,(ulong)(local_520._8_8_ + 1));
        }
        if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
          operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1);
        }
        psVar3 = &this->SimplifyBuildDir;
        if ((char *)0x14 < (ulong)uVar9) {
          pcVar5 = (this->super_cmCTestGenericHandler).CTest;
          pcVar20 = local_580 + 0x10;
          local_580._0_8_ = pcVar20;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"BuildDirectory","");
          cmCTest::GetCTestConfiguration((string *)local_6f8,pcVar5,(string *)local_580);
          plVar14 = (long *)std::__cxx11::string::append(local_6f8);
          pp_Var16 = (_func_int **)(plVar14 + 2);
          if ((_func_int **)*plVar14 == pp_Var16) {
            local_520._8_8_ = *pp_Var16;
            local_520._16_8_ = plVar14[3];
            local_528 = (undefined1  [8])(local_520 + 8);
          }
          else {
            local_520._8_8_ = *pp_Var16;
            local_528 = (undefined1  [8])*plVar14;
          }
          local_520._0_8_ = plVar14[1];
          *plVar14 = (long)pp_Var16;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
            operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1);
          }
          if ((char *)local_580._0_8_ != pcVar20) {
            operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
          }
          local_6f8._0_8_ = local_6f8 + 0x10;
          local_6f8._8_8_ = 0;
          local_6f8[0x10] = '\0';
          if ((char *)(local_520._0_8_ + -2) != (char *)0x0) {
            pcVar22 = (char *)(local_520._0_8_ + -2) + (long)local_528;
            pcVar19 = (char *)(local_520._0_8_ + -1);
            do {
              if (*pcVar22 == '/') {
                strlen(pcVar22);
                std::__cxx11::string::_M_replace((ulong)local_6f8,0,(char *)0x0,(ulong)pcVar22);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_580,"/...",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_6f8);
                std::__cxx11::string::operator=((string *)local_6f8,(string *)local_580);
                if ((char *)local_580._0_8_ != pcVar20) {
                  operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
                }
                std::__cxx11::string::substr((ulong)local_580,(ulong)local_528);
                std::__cxx11::string::operator=((string *)local_528,(string *)local_580);
                if ((char *)local_580._0_8_ != pcVar20) {
                  operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
                }
                break;
              }
              pcVar22 = pcVar22 + -1;
              pcVar19 = pcVar19 + -1;
            } while (pcVar19 != (char *)0x1);
          }
          std::__cxx11::string::_M_assign((string *)psVar3);
          if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
            operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1);
          }
          if (local_528 != (undefined1  [8])(local_520 + 8)) {
            operator_delete((void *)local_528,(ulong)(local_520._8_8_ + 1));
          }
        }
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)local_528,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->StartBuild,(string *)local_528);
        if (local_528 != (undefined1  [8])(local_520 + 8)) {
          operator_delete((void *)local_528,(ulong)(local_520._8_8_ + 1));
        }
        rVar15 = std::chrono::_V2::system_clock::now();
        (this->StartBuildTime).__d.__r = rVar15;
        local_720 = 0;
        bVar10 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
        if (bVar10) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_528,"Build with command: ",0x14);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_528,local_2d8._M_dataplus._M_p,
                               local_2d8._M_string_length);
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
          pcVar5 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar5,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1aa,(char *)local_6f8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
          if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
            operator_delete((void *)local_6f8._0_8_,CONCAT71(local_6f8._17_7_,local_6f8[0x10]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
          std::ios_base::~ios_base(local_4b8);
          local_71c = 0;
        }
        else {
          iVar11 = RunMakeCommand(this,&local_2d8,&local_720,local_2b8._M_dataplus._M_p,0,
                                  (ostream *)local_278,Auto);
          local_71c = CONCAT31((int3)((uint)iVar11 >> 8),iVar11 != 4);
        }
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)local_528,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->EndBuild,(string *)local_528);
        if (local_528 != (undefined1  [8])(local_520 + 8)) {
          operator_delete((void *)local_528,(ulong)(local_520._8_8_ + 1));
        }
        rVar15 = std::chrono::_V2::system_clock::now();
        (this->EndBuildTime).__d.__r = rVar15;
        lVar17 = std::chrono::_V2::steady_clock::now();
        if ((this->SimplifySourceDir)._M_string_length != 0) {
          pcVar7 = (this->ErrorsAndWarnings).
                   super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pcVar23 = (this->ErrorsAndWarnings).
                         super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                         ._M_impl.super__Vector_impl_data._M_start; pcVar23 != pcVar7;
              pcVar23 = pcVar23 + 1) {
            cmsys::SystemTools::ReplaceString(&pcVar23->Text,(psVar2->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar23->PreContext,(psVar2->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar23->PostContext,(psVar2->_M_dataplus)._M_p,"/.../");
          }
        }
        if ((this->SimplifyBuildDir)._M_string_length != 0) {
          pcVar7 = (this->ErrorsAndWarnings).
                   super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pcVar23 = (this->ErrorsAndWarnings).
                         super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                         ._M_impl.super__Vector_impl_data._M_start; pcVar23 != pcVar7;
              pcVar23 = pcVar23 + 1) {
            cmsys::SystemTools::ReplaceString(&pcVar23->Text,(psVar3->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar23->PreContext,(psVar3->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar23->PostContext,(psVar3->_M_dataplus)._M_p,"/.../");
          }
        }
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_528,None);
        bVar10 = cmCTestGenericHandler::StartResultingXML
                           (&this->super_cmCTestGenericHandler,PartBuild,"Build",
                            (cmGeneratedFileStream *)local_528);
        if (bVar10) {
          cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_580,(ostream *)local_528,0);
          GenerateXMLHeader(this,(cmXMLWriter *)local_580);
          if (this->UseCTestLaunch == true) {
            GenerateXMLLaunched(this,(cmXMLWriter *)local_580);
          }
          else {
            GenerateXMLLogScraped(this,(cmXMLWriter *)local_580);
          }
          GenerateXMLFooter(this,(cmXMLWriter *)local_580,
                            (cmDuration)((double)(lVar17 - local_2e0) / 1000000000.0));
          if (((char)local_71c != '\0' || local_720 != 0) || (0 < this->TotalErrors)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_6f8,"Error(s) when building project",0x1e);
            std::ios::widen((char)(ostream *)local_6f8 +
                            (char)*(undefined8 *)(local_6f8._0_8_ + -0x18));
            std::ostream::put((char)local_6f8);
            std::ostream::flush();
            pcVar5 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar5,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x1dc,(char *)local_718,false);
            if (local_718 != local_708) {
              operator_delete(local_718,local_708[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
            std::ios_base::~ios_base(local_688);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6f8,"   ",3);
          poVar13 = (ostream *)std::ostream::operator<<(local_6f8,this->TotalErrors);
          pcVar20 = " or more";
          pcVar19 = " or more";
          if (this->TotalErrors < this->MaxErrors) {
            pcVar19 = "";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,pcVar19,(ulong)(this->MaxErrors <= this->TotalErrors) << 3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," Compiler errors",0x10);
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
          pcVar5 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar5,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1e3,(char *)local_718,false);
          if (local_718 != local_708) {
            operator_delete(local_718,local_708[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
          std::ios_base::~ios_base(local_688);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6f8,"   ",3);
          poVar13 = (ostream *)std::ostream::operator<<(local_6f8,this->TotalWarnings);
          if (this->TotalWarnings < this->MaxWarnings) {
            pcVar20 = "";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,pcVar20,(ulong)(this->MaxWarnings <= this->TotalWarnings) << 3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13," Compiler warnings",0x12);
          std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
          std::ostream::put((char)poVar13);
          std::ostream::flush();
          pcVar5 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar5,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1e8,(char *)local_718,false);
          if (local_718 != local_708) {
            operator_delete(local_718,local_708[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
          std::ios_base::~ios_base(local_688);
          iVar11 = local_720;
          cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_580);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_6f8,"Cannot create build XML file",0x1c);
          std::ios::widen((char)(ostream *)local_6f8 +
                          (char)*(undefined8 *)(local_6f8._0_8_ + -0x18));
          std::ostream::put((char)local_6f8);
          std::ostream::flush();
          pcVar5 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar5,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1ce,(char *)local_580._0_8_,false);
          if ((undefined1 *)local_580._0_8_ != local_580 + 0x10) {
            operator_delete((void *)local_580._0_8_,local_580._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f8);
          std::ios_base::~ios_base(local_688);
          iVar11 = -1;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_528);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar11;
}

Assistant:

int cmCTestBuildHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "Build project" << std::endl,
                     this->Quiet);

  // do we have time for this
  if (this->CTest->GetRemainingTimeAllowed() < std::chrono::minutes(2)) {
    return 0;
  }

  int entry;
  for (entry = 0; cmCTestWarningErrorFileLine[entry].RegularExpressionString;
       ++entry) {
    cmCTestBuildHandler::cmCTestCompileErrorWarningRex r;
    if (r.RegularExpression.compile(
          cmCTestWarningErrorFileLine[entry].RegularExpressionString)) {
      r.FileIndex = cmCTestWarningErrorFileLine[entry].FileIndex;
      r.LineIndex = cmCTestWarningErrorFileLine[entry].LineIndex;
      this->ErrorWarningFileLineRegex.push_back(std::move(r));
    } else {
      cmCTestLog(
        this->CTest, ERROR_MESSAGE,
        "Problem Compiling regular expression: "
          << cmCTestWarningErrorFileLine[entry].RegularExpressionString
          << std::endl);
    }
  }

  // Determine build command and build directory
  std::string makeCommand = this->GetMakeCommand();
  if (makeCommand.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find MakeCommand key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  const std::string& buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  std::string const& useLaunchers =
    this->CTest->GetCTestConfiguration("UseLaunchers");
  this->UseCTestLaunch = cmSystemTools::IsOn(useLaunchers);

  // Create a last build log
  cmGeneratedFileStream ofs;
  auto elapsed_time_start = std::chrono::steady_clock::now();
  if (!this->StartLogFile("Build", ofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build log file" << std::endl);
  }

  // Create lists of regular expression strings for errors, error exceptions,
  // warnings and warning exceptions.
  std::vector<std::string>::size_type cc;
  for (cc = 0; cmCTestErrorMatches[cc]; cc++) {
    this->CustomErrorMatches.emplace_back(cmCTestErrorMatches[cc]);
  }
  for (cc = 0; cmCTestErrorExceptions[cc]; cc++) {
    this->CustomErrorExceptions.emplace_back(cmCTestErrorExceptions[cc]);
  }
  for (cc = 0; cmCTestWarningMatches[cc]; cc++) {
    this->CustomWarningMatches.emplace_back(cmCTestWarningMatches[cc]);
  }

  for (cc = 0; cmCTestWarningExceptions[cc]; cc++) {
    this->CustomWarningExceptions.emplace_back(cmCTestWarningExceptions[cc]);
  }

  // Pre-compile regular expressions objects for all regular expressions

#define cmCTestBuildHandlerPopulateRegexVector(strings, regexes)              \
  do {                                                                        \
    regexes.clear();                                                          \
    cmCTestOptionalLog(this->CTest, DEBUG,                                    \
                       this << "Add " #regexes << std::endl, this->Quiet);    \
    for (std::string const& s : (strings)) {                                  \
      cmCTestOptionalLog(this->CTest, DEBUG,                                  \
                         "Add " #strings ": " << s << std::endl,              \
                         this->Quiet);                                        \
      (regexes).emplace_back(s);                                              \
    }                                                                         \
  } while (false)

  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorMatches,
                                         this->ErrorMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorExceptions,
                                         this->ErrorExceptionRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningMatches,
                                         this->WarningMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningExceptions,
                                         this->WarningExceptionRegex);

  // Determine source and binary tree substitutions to simplify the output.
  this->SimplifySourceDir.clear();
  this->SimplifyBuildDir.clear();
  if (this->CTest->GetCTestConfiguration("SourceDirectory").size() > 20) {
    std::string srcdir =
      this->CTest->GetCTestConfiguration("SourceDirectory") + "/";
    std::string srcdirrep;
    for (cc = srcdir.size() - 2; cc > 0; cc--) {
      if (srcdir[cc] == '/') {
        srcdirrep = srcdir.c_str() + cc;
        srcdirrep = "/..." + srcdirrep;
        srcdir = srcdir.substr(0, cc + 1);
        break;
      }
    }
    this->SimplifySourceDir = srcdir;
  }
  if (this->CTest->GetCTestConfiguration("BuildDirectory").size() > 20) {
    std::string bindir =
      this->CTest->GetCTestConfiguration("BuildDirectory") + "/";
    std::string bindirrep;
    for (cc = bindir.size() - 2; cc > 0; cc--) {
      if (bindir[cc] == '/') {
        bindirrep = bindir.c_str() + cc;
        bindirrep = "/..." + bindirrep;
        bindir = bindir.substr(0, cc + 1);
        break;
      }
    }
    this->SimplifyBuildDir = bindir;
  }

  // Ok, let's do the build

  // Remember start build time
  this->StartBuild = this->CTest->CurrentTime();
  this->StartBuildTime = std::chrono::system_clock::now();
  int retVal = 0;
  int res = cmsysProcess_State_Exited;
  if (!this->CTest->GetShowOnly()) {
    res = this->RunMakeCommand(makeCommand, &retVal, buildDirectory.c_str(), 0,
                               ofs);
  } else {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Build with command: " << makeCommand << std::endl,
                       this->Quiet);
  }

  // Remember end build time and calculate elapsed time
  this->EndBuild = this->CTest->CurrentTime();
  this->EndBuildTime = std::chrono::system_clock::now();
  auto elapsed_build_time =
    std::chrono::steady_clock::now() - elapsed_time_start;

  // Cleanups strings in the errors and warnings list.
  if (!this->SimplifySourceDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifySourceDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
    }
  }

  if (!this->SimplifyBuildDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifyBuildDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
    }
  }

  // Generate XML output
  cmGeneratedFileStream xofs;
  if (!this->StartResultingXML(cmCTest::PartBuild, "Build", xofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build XML file" << std::endl);
    return -1;
  }
  cmXMLWriter xml(xofs);
  this->GenerateXMLHeader(xml);
  if (this->UseCTestLaunch) {
    this->GenerateXMLLaunched(xml);
  } else {
    this->GenerateXMLLogScraped(xml);
  }
  this->GenerateXMLFooter(xml, elapsed_build_time);

  if (res != cmsysProcess_State_Exited || retVal || this->TotalErrors > 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error(s) when building project" << std::endl);
  }

  // Display message about number of errors and warnings
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   " << this->TotalErrors
                   << (this->TotalErrors >= this->MaxErrors ? " or more" : "")
                   << " Compiler errors" << std::endl);
  cmCTestLog(
    this->CTest, HANDLER_OUTPUT,
    "   " << this->TotalWarnings
          << (this->TotalWarnings >= this->MaxWarnings ? " or more" : "")
          << " Compiler warnings" << std::endl);

  return retVal;
}